

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_print(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  cTValue *pcVar3;
  cTValue *pcVar4;
  char *s;
  long lVar5;
  long lVar6;
  bool bVar7;
  size_t size;
  char buf [32];
  
  pTVar2 = L->base;
  pcVar3 = L->top;
  pcVar4 = lj_tab_getstr((GCtab *)(ulong)(L->env).gcptr32,
                         (GCstr *)(ulong)*(uint *)((ulong)pTVar2[-1].u32.lo + 0x20));
  if ((pcVar4 == (cTValue *)0x0) || ((pcVar4->field_2).it == 0xffffffff)) {
    L->top = pcVar3 + 1;
    (pcVar3->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)pTVar2[-1].u32.lo + 0x20);
    (pcVar3->field_2).it = 0xfffffffb;
    lua_gettable(L,-0x2712);
    pcVar4 = L->top + -1;
  }
  else {
    L->top = pcVar3 + 1;
    pcVar3->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pcVar4;
  }
  lVar5 = (long)pcVar3 - (long)pTVar2 >> 3;
  if ((pcVar4->field_2).it == 0xfffffff7) {
    bVar7 = *(char *)((ulong)(pcVar4->u32).lo + 6) == '\x13';
  }
  else {
    bVar7 = false;
  }
  lVar6 = 0;
  if (lVar5 < 1) {
    lVar5 = lVar6;
  }
  do {
    if (lVar5 * 8 == lVar6) {
      putchar(10);
      return 0;
    }
    pcVar3 = (cTValue *)((long)L->base + lVar6);
    if (bVar7) {
      uVar1 = *(uint *)((long)L->base + lVar6 + 4);
      if (uVar1 == 0xfffffffb) {
        size = (size_t)*(uint *)((ulong)(pcVar3->u32).lo + 0xc);
        s = (char *)((ulong)(pcVar3->u32).lo + 0x10);
      }
      else {
        if (0xfffefffe < uVar1) goto LAB_0013c1b9;
        s = buf;
        size = lj_str_bufnum(s,pcVar3);
      }
    }
    else {
LAB_0013c1b9:
      L->top[1] = *pcVar3;
      *L->top = L->top[-1];
      L->top = L->top + 2;
      lua_call(L,1,1);
      s = lua_tolstring(L,-1,&size);
      if (s == (char *)0x0) {
        lj_err_caller(L,LJ_ERR_PRTOSTR);
      }
      L->top = L->top + -1;
    }
    if (lVar6 != 0) {
      putchar(9);
    }
    fwrite(s,1,size,_stdout);
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

LJLIB_CF(print)
{
  ptrdiff_t i, nargs = L->top - L->base;
  cTValue *tv = lj_tab_getstr(tabref(L->env), strV(lj_lib_upvalue(L, 1)));
  int shortcut;
  if (tv && !tvisnil(tv)) {
    copyTV(L, L->top++, tv);
  } else {
    setstrV(L, L->top++, strV(lj_lib_upvalue(L, 1)));
    lua_gettable(L, LUA_GLOBALSINDEX);
    tv = L->top-1;
  }
  shortcut = (tvisfunc(tv) && funcV(tv)->c.ffid == FF_tostring);
  for (i = 0; i < nargs; i++) {
    const char *str;
    size_t size;
    cTValue *o = &L->base[i];
    if (shortcut && tvisstr(o)) {
      str = strVdata(o);
      size = strV(o)->len;
    } else if (shortcut && tvisint(o)) {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, intV(o));
      size = (size_t)(buf+LJ_STR_INTBUF-p);
      str = p;
    } else if (shortcut && tvisnum(o)) {
      char buf[LJ_STR_NUMBUF];
      size = lj_str_bufnum(buf, o);
      str = buf;
    } else {
      copyTV(L, L->top+1, o);
      copyTV(L, L->top, L->top-1);
      L->top += 2;
      lua_call(L, 1, 1);
      str = lua_tolstring(L, -1, &size);
      if (!str)
	lj_err_caller(L, LJ_ERR_PRTOSTR);
      L->top--;
    }
    if (i)
      putchar('\t');
    fwrite(str, 1, size, stdout);
  }
  putchar('\n');
  return 0;
}